

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

pair<bool,_bool> qpdf::Name::analyzeJSONEncoding(string *name)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool local_4d;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  bool local_49;
  bool local_48;
  bool local_47;
  bool local_46;
  bool local_45;
  bool local_44;
  bool local_43;
  bool local_42;
  byte local_41;
  byte *pbStack_40;
  uchar c;
  char *it;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  bool needs_escaping;
  bool tail3;
  bool tail2;
  int tail;
  string *name_local;
  
  __range1._4_4_ = 0;
  bVar3 = false;
  bVar4 = false;
  bVar2 = false;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  it = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&it);
    if (!bVar1) {
      local_4c = __range1._4_4_ == 0;
      local_4d = (bool)(bVar2 ^ 1);
      std::pair<bool,_bool>::pair<bool,_bool,_true>
                ((pair<bool,_bool> *)((long)&name_local + 6),&local_4c,&local_4d);
      return name_local._6_2_;
    }
    pbStack_40 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&__end1);
    local_41 = *pbStack_40;
    if (__range1._4_4_ == 0) {
      if (local_41 < 0x80) {
        if (!bVar2) {
          if (((local_41 < 0x23) || (bVar2 = true, local_41 == 0x5c)) &&
             (bVar2 = true, local_41 != 0x20)) {
            bVar2 = local_41 == 0x21;
          }
          bVar2 = (bool)(bVar2 ^ 1);
        }
      }
      else if ((local_41 & 0xe0) == 0xc0) {
        if ((local_41 & 0xfe) == 0xc0) {
          local_48 = false;
          local_49 = false;
          std::pair<bool,_bool>::pair<bool,_bool,_true>
                    ((pair<bool,_bool> *)((long)&name_local + 6),&local_48,&local_49);
          return name_local._6_2_;
        }
        __range1._4_4_ = 1;
      }
      else if ((local_41 & 0xf0) == 0xe0) {
        bVar3 = local_41 == 0xe0;
        __range1._4_4_ = 2;
      }
      else {
        if ((local_41 & 0xf8) != 0xf0) {
          local_4a = false;
          local_4b = false;
          std::pair<bool,_bool>::pair<bool,_bool,_true>
                    ((pair<bool,_bool> *)((long)&name_local + 6),&local_4a,&local_4b);
          return name_local._6_2_;
        }
        bVar4 = local_41 == 0xf0;
        __range1._4_4_ = 3;
      }
    }
    else {
      if ((local_41 & 0xc0) != 0x80) {
        local_42 = false;
        local_43 = false;
        std::pair<bool,_bool>::pair<bool,_bool,_true>
                  ((pair<bool,_bool> *)((long)&name_local + 6),&local_42,&local_43);
        return name_local._6_2_;
      }
      if (bVar3) {
        if ((local_41 & 0xe0) == 0x80) {
          local_44 = false;
          local_45 = false;
          std::pair<bool,_bool>::pair<bool,_bool,_true>
                    ((pair<bool,_bool> *)((long)&name_local + 6),&local_44,&local_45);
          return name_local._6_2_;
        }
        bVar3 = false;
      }
      else if (bVar4) {
        if ((local_41 & 0xf0) == 0x80) {
          local_46 = false;
          local_47 = false;
          std::pair<bool,_bool>::pair<bool,_bool,_true>
                    ((pair<bool,_bool> *)((long)&name_local + 6),&local_46,&local_47);
          return name_local._6_2_;
        }
        bVar4 = false;
      }
      __range1._4_4_ = __range1._4_4_ + -1;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::pair<bool, bool>
Name::analyzeJSONEncoding(const std::string& name)
{
    int tail = 0;       // Number of continuation characters expected.
    bool tail2 = false; // Potential overlong 3 octet utf-8.
    bool tail3 = false; // potential overlong 4 octet
    bool needs_escaping = false;
    for (auto const& it: name) {
        auto c = static_cast<unsigned char>(it);
        if (tail) {
            if ((c & 0xc0) != 0x80) {
                return {false, false};
            }
            if (tail2) {
                if ((c & 0xe0) == 0x80) {
                    return {false, false};
                }
                tail2 = false;
            } else if (tail3) {
                if ((c & 0xf0) == 0x80) {
                    return {false, false};
                }
                tail3 = false;
            }
            tail--;
        } else if (c < 0x80) {
            if (!needs_escaping) {
                needs_escaping = !((c > 34 && c != '\\') || c == ' ' || c == 33);
            }
        } else if ((c & 0xe0) == 0xc0) {
            if ((c & 0xfe) == 0xc0) {
                return {false, false};
            }
            tail = 1;
        } else if ((c & 0xf0) == 0xe0) {
            tail2 = (c == 0xe0);
            tail = 2;
        } else if ((c & 0xf8) == 0xf0) {
            tail3 = (c == 0xf0);
            tail = 3;
        } else {
            return {false, false};
        }
    }
    return {tail == 0, !needs_escaping};
}